

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

int glu::anon_unknown_4::getIndexSize(IndexType type)

{
  undefined4 local_c;
  IndexType type_local;
  
  if (type == INDEXTYPE_UINT8) {
    local_c = 1;
  }
  else if (type == INDEXTYPE_UINT16) {
    local_c = 2;
  }
  else if (type == INDEXTYPE_UINT32) {
    local_c = 4;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int getIndexSize (IndexType type)
{
	switch (type)
	{
		case INDEXTYPE_UINT8:	return 1;
		case INDEXTYPE_UINT16:	return 2;
		case INDEXTYPE_UINT32:	return 4;
		default:
			DE_ASSERT(false);
			return 0;
	}
}